

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool DetectStaticData(FILE *fp,VecVector3d *gyro,VecVector3d *accel)

{
  code *pcVar1;
  int iVar2;
  _Setprecision _Var3;
  size_t sVar4;
  ostream *poVar5;
  void *pvVar6;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_RSI;
  FILE *in_RDI;
  Output *__ptr;
  double extraout_XMM0_Qa;
  Output p;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_00000148;
  ostream *in_stack_00000150;
  value_type *in_stack_fffffffffffffef8;
  Scalar *in_stack_ffffffffffffff18;
  Scalar *in_stack_ffffffffffffff20;
  Scalar *in_stack_ffffffffffffff28;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_ffffffffffffff30;
  Output local_58;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *local_18;
  FILE *local_10;
  bool local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar2 = feof(in_RDI);
  if (iVar2 != 0) {
LAB_001a7fa6:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  Output::Output(&local_58);
  __ptr = &local_58;
  sVar4 = fread(__ptr,0x38,1,local_10);
  if (sVar4 == 0) {
    local_1 = false;
  }
  else {
    std::abs((int)__ptr);
    if (extraout_XMM0_Qa <= 1.25e-05) {
      _Var3 = std::setprecision(0xf);
      poVar5 = std::operator<<((ostream *)&std::cout,_Var3);
      pvVar6 = (void *)std::ostream::operator<<(poVar5,local_58.time);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      Deg2Rad(local_58.gx * 200.0);
      Deg2Rad(local_58.gy * 200.0);
      Deg2Rad(local_58.gz * 200.0);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff18);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::push_back(local_18,in_stack_fffffffffffffef8);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff18);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::push_back(local_18,in_stack_fffffffffffffef8);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(Scalar *)(local_58.ax * 200.0)
                 ,(Scalar *)(local_58.ay * 200.0));
      poVar5 = Eigen::operator<<(in_stack_00000150,in_stack_00000148);
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
      goto LAB_001a7fa6;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool DetectStaticData(FILE* fp, VecVector3d &gyro, VecVector3d &accel)
{
    while (!feof(fp))
    {
        Output p;
        if(!fread(&p, sizeof(p), 1, fp))
            return false;
        if(abs(p.gx) > 1.25e-5)
            return true;
        cout << setprecision(15) << p.time << endl;
        gyro.push_back(Vector3d(Deg2Rad(p.gx * ZCF), Deg2Rad(p.gy * ZCF), Deg2Rad(p.gz * ZCF)));
        accel.push_back(Vector3d(p.ax * ZCF, p.ay * ZCF, p.az * ZCF));
        cout << Vector3d(p.ax * ZCF, p.ay * ZCF, -p.az * ZCF) << endl << endl;
        break;
        // cout << gyro.size() << endl;
        // cout << accel.size() << endl;
    }
}